

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_streams.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,RandomStreams *stream)

{
  int iVar1;
  ostream *poVar2;
  double dVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  RandomStreams *stream_local;
  ostream *os_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = RandomStreams::NumStreams(stream);
    if (iVar1 <= local_1c) break;
    poVar2 = std::operator<<(os,"Stream ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    std::operator<<(poVar2,":");
    local_20 = 0;
    while( true ) {
      iVar1 = RandomStreams::Length(stream);
      if (iVar1 <= local_20) break;
      poVar2 = std::operator<<(os," ");
      dVar3 = RandomStreams::Entry(stream,local_1c,local_20);
      std::ostream::operator<<(poVar2,dVar3);
      local_20 = local_20 + 1;
    }
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const RandomStreams& stream) {
	for (int i = 0; i < stream.NumStreams(); i++) {
		os << "Stream " << i << ":";
		for (int j = 0; j < stream.Length(); j++) {
			os << " " << stream.Entry(i, j);
		}
		os << endl;
	}
	return os;
}